

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitpacking.cpp
# Opt level: O0

bool __thiscall
duckdb::BitpackingState<unsigned_short,short>::
Flush<duckdb::BitpackingCompressionState<unsigned_short,true,short>::BitpackingWriter>
          (BitpackingState<unsigned_short,_short> *this)

{
  bitpacking_width_t bVar1;
  unsigned_long uVar2;
  idx_t iVar3;
  BitpackingState<unsigned_short,_short> *in_RDI;
  BitpackingState<unsigned_short,_short> *unaff_retaddr;
  void *in_stack_00000008;
  bitpacking_width_t width;
  bitpacking_width_t regular_required_bitwidth;
  bitpacking_width_t delta_required_bitwidth;
  unsigned_short frame_of_reference;
  undefined8 in_stack_ffffffffffffffc8;
  bitpacking_width_t bVar4;
  BitpackingState<unsigned_short,_short> *in_stack_ffffffffffffffd0;
  void *count;
  bool *in_stack_ffffffffffffffd8;
  undefined4 in_stack_ffffffffffffffe8;
  undefined4 uVar5;
  byte in_stack_ffffffffffffffec;
  byte in_stack_ffffffffffffffed;
  undefined2 in_stack_ffffffffffffffee;
  BitpackingState<unsigned_short,_short> *values;
  bool local_1;
  
  bVar4 = (bitpacking_width_t)((ulong)in_stack_ffffffffffffffc8 >> 0x38);
  if (in_RDI->compression_buffer_idx == 0) {
    local_1 = true;
  }
  else if ((((in_RDI->all_invalid & 1U) == 0) && (in_RDI->maximum != in_RDI->minimum)) ||
          ((in_RDI->mode != AUTO && (in_RDI->mode != CONSTANT)))) {
    values = in_RDI;
    BitpackingState<unsigned_short,_short>::CalculateFORStats(in_stack_ffffffffffffffd0);
    BitpackingState<unsigned_short,_short>::CalculateDeltaStats(unaff_retaddr);
    if ((in_RDI->can_do_delta & 1U) != 0) {
      if (((in_RDI->maximum_delta == in_RDI->minimum_delta) && (in_RDI->mode != FOR)) &&
         (in_RDI->mode != DELTA_FOR)) {
        BitpackingCompressionState<unsigned_short,_true,_short>::BitpackingWriter::
        WriteConstantDelta((short)((ulong)values >> 0x30),(unsigned_short)((ulong)values >> 0x20),
                           CONCAT26(*in_RDI->compression_buffer,
                                    CONCAT15(in_stack_ffffffffffffffed,
                                             CONCAT14(in_stack_ffffffffffffffec,
                                                      in_stack_ffffffffffffffe8))),
                           in_RDI->compression_buffer_internal,in_stack_ffffffffffffffd8,
                           in_stack_ffffffffffffffd0);
        in_RDI->total_size = in_RDI->total_size + 8;
        return true;
      }
      in_stack_ffffffffffffffed = BitpackingPrimitives::MinimumBitWidth<unsigned_short,false>(0);
      in_stack_ffffffffffffffec = BitpackingPrimitives::MinimumBitWidth<unsigned_short,false>(0);
      if ((in_stack_ffffffffffffffed < in_stack_ffffffffffffffec) && (in_RDI->mode != FOR)) {
        BitpackingState<unsigned_short,_short>::SubtractFrameOfReference<short>
                  (in_RDI,in_RDI->delta_buffer,in_RDI->minimum_delta);
        bVar4 = (bitpacking_width_t)(in_RDI->compression_buffer_idx >> 0x38);
        count = in_RDI->data_ptr;
        BitpackingCompressionState<unsigned_short,_true,_short>::BitpackingWriter::WriteDeltaFor
                  (values->compression_buffer_internal,
                   (bool *)CONCAT26(in_stack_ffffffffffffffee,
                                    CONCAT15(in_stack_ffffffffffffffed,
                                             CONCAT14(in_stack_ffffffffffffffec,
                                                      in_stack_ffffffffffffffe8))),
                   (bitpacking_width_t)((ulong)in_RDI >> 0x38),
                   (unsigned_short)((ulong)in_RDI >> 0x20),(short)((ulong)in_RDI >> 0x10),
                   (unsigned_short *)in_stack_ffffffffffffffd8,(idx_t)unaff_retaddr,
                   in_stack_00000008);
        in_RDI->total_size = in_RDI->total_size + 2;
        uVar2 = AlignValue<unsigned_long,_8UL>(1);
        in_RDI->total_size = uVar2 + in_RDI->total_size;
        in_RDI->total_size = in_RDI->total_size + 2;
        iVar3 = BitpackingPrimitives::GetRequiredSize((idx_t)count,bVar4);
        in_RDI->total_size = iVar3 + in_RDI->total_size;
        return true;
      }
    }
    if ((in_RDI->can_do_for & 1U) == 0) {
      local_1 = false;
    }
    else {
      bVar1 = BitpackingPrimitives::MinimumBitWidth<unsigned_short,false>(0);
      uVar5 = CONCAT13(bVar1,(int3)in_stack_ffffffffffffffe8);
      BitpackingState<unsigned_short,_short>::SubtractFrameOfReference<unsigned_short>
                (in_RDI,in_RDI->compression_buffer,in_RDI->minimum);
      BitpackingCompressionState<unsigned_short,_true,_short>::BitpackingWriter::WriteFor
                (values->compression_buffer_internal,
                 (bool *)CONCAT26(in_stack_ffffffffffffffee,
                                  CONCAT15(in_stack_ffffffffffffffed,
                                           CONCAT14(in_stack_ffffffffffffffec,uVar5))),
                 (bitpacking_width_t)((ulong)in_RDI >> 0x38),(unsigned_short)((ulong)in_RDI >> 0x20)
                 ,(idx_t)in_stack_ffffffffffffffd8,in_stack_ffffffffffffffd0);
      iVar3 = BitpackingPrimitives::GetRequiredSize((idx_t)in_stack_ffffffffffffffd0,bVar4);
      in_RDI->total_size = iVar3 + in_RDI->total_size;
      in_RDI->total_size = in_RDI->total_size + 2;
      uVar2 = AlignValue<unsigned_long,_8UL>(1);
      in_RDI->total_size = uVar2 + in_RDI->total_size;
      local_1 = true;
    }
  }
  else {
    BitpackingCompressionState<unsigned_short,_true,_short>::BitpackingWriter::WriteConstant
              ((unsigned_short)((ulong)in_RDI >> 0x30),(idx_t)in_stack_ffffffffffffffd8,
               in_stack_ffffffffffffffd0,(bool)bVar4);
    in_RDI->total_size = in_RDI->total_size + 6;
    local_1 = true;
  }
  return local_1;
}

Assistant:

bool Flush() {
		if (compression_buffer_idx == 0) {
			return true;
		}

		if ((all_invalid || maximum == minimum) && (mode == BitpackingMode::AUTO || mode == BitpackingMode::CONSTANT)) {
			OP::WriteConstant(maximum, compression_buffer_idx, data_ptr, all_invalid);
			total_size += sizeof(T) + sizeof(bitpacking_metadata_encoded_t);
			return true;
		}

		CalculateFORStats();
		CalculateDeltaStats();

		if (can_do_delta) {
			if (maximum_delta == minimum_delta && mode != BitpackingMode::FOR && mode != BitpackingMode::DELTA_FOR) {
				// FOR needs to be T (considering hugeint is bigger than idx_t)
				T frame_of_reference = compression_buffer[0];

				OP::WriteConstantDelta(maximum_delta, static_cast<T>(frame_of_reference), compression_buffer_idx,
				                       compression_buffer, compression_buffer_validity, data_ptr);
				total_size += sizeof(T) + sizeof(T) + sizeof(bitpacking_metadata_encoded_t);
				return true;
			}

			// Check if delta has benefit
			auto delta_required_bitwidth =
			    BitpackingPrimitives::MinimumBitWidth<T, false>(static_cast<T>(min_max_delta_diff));
			auto regular_required_bitwidth = BitpackingPrimitives::MinimumBitWidth(min_max_diff);

			if (delta_required_bitwidth < regular_required_bitwidth && mode != BitpackingMode::FOR) {
				SubtractFrameOfReference(delta_buffer, minimum_delta);

				OP::WriteDeltaFor(reinterpret_cast<T *>(delta_buffer), compression_buffer_validity,
				                  delta_required_bitwidth, static_cast<T>(minimum_delta), delta_offset,
				                  compression_buffer, compression_buffer_idx, data_ptr);

				// FOR (frame of reference).
				total_size += sizeof(T);
				// Aligned bitpacking width.
				total_size += AlignValue(sizeof(bitpacking_width_t));
				// Delta offset.
				total_size += sizeof(T);
				// Compressed data size.
				total_size += BitpackingPrimitives::GetRequiredSize(compression_buffer_idx, delta_required_bitwidth);

				return true;
			}
		}

		if (can_do_for) {
			auto width = BitpackingPrimitives::MinimumBitWidth<T, false>(min_max_diff);
			SubtractFrameOfReference(compression_buffer, minimum);
			OP::WriteFor(compression_buffer, compression_buffer_validity, width, minimum, compression_buffer_idx,
			             data_ptr);

			total_size += BitpackingPrimitives::GetRequiredSize(compression_buffer_idx, width);
			total_size += sizeof(T); // FOR value
			total_size += AlignValue(sizeof(bitpacking_width_t));

			return true;
		}

		return false;
	}